

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::Encode
          (IntercomCommunicationParameters *this,KDataStream *stream)

{
  KDataStream *this_00;
  KDataStream *stream_local;
  IntercomCommunicationParameters *this_local;
  
  this_00 = KDataStream::operator<<(stream,this->m_ui16Type);
  KDataStream::operator<<(this_00,this->m_ui16Length);
  if (this->m_pRecord != (DataTypeBase *)0x0) {
    (*this->m_pRecord->_vptr_DataTypeBase[5])(this->m_pRecord,stream);
  }
  return;
}

Assistant:

void IntercomCommunicationParameters::Encode( KDataStream & stream ) const
{
    stream << m_ui16Type
           << m_ui16Length;

    if( m_pRecord )
        m_pRecord->Encode( stream );
}